

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O2

void __thiscall LTWeather::Set(LTWeather *this)

{
  char *__s;
  XDR_float *this_00;
  float v;
  allocator<char> local_31;
  string local_30;
  
  XDR_int::set(&wdr_update_immediately,(uint)this->update_immediately);
  XDR_int::set(&wdr_change_mode,3);
  XDR_float::set(&wdr_visibility_reported_sm,this->visibility_reported_sm);
  XDR_float::set(&wdr_sealevel_temperature_c,this->sealevel_temperature_c);
  XDR_float::set(&wdr_qnh_base_elevation,this->qnh_base_elevation);
  v = this->qnh_pas;
  if (NAN(v)) {
    v = this->sealevel_pressure_pas;
    this_00 = &wdr_sealevel_pressure_pas;
  }
  else {
    this_00 = &wdr_qnh_pas;
  }
  XDR_float::set(this_00,v);
  XDR_float::set(&wdr_rain_percent,this->rain_percent);
  XDR_farr<13UL>::set(&wdr_wind_altitude_msl_m,&this->wind_altitude_msl_m);
  XDR_farr<13UL>::set(&wdr_wind_speed_msc,&this->wind_speed_msc);
  XDR_farr<13UL>::set(&wdr_wind_direction_degt,&this->wind_direction_degt);
  XDR_farr<13UL>::set(&wdr_shear_speed_msc,&this->shear_speed_msc);
  XDR_farr<13UL>::set(&wdr_shear_direction_degt,&this->shear_direction_degt);
  XDR_farr<13UL>::set(&wdr_turbulence,&this->turbulence);
  XDR_farr<13UL>::set(&wdr_dewpoint_deg_c,&this->dewpoint_deg_c);
  XDR_farr<13UL>::set(&wdr_temperature_altitude_msl_m,&this->temperature_altitude_msl_m);
  XDR_farr<13UL>::set(&wdr_temperatures_aloft_deg_c,&this->temperatures_aloft_deg_c);
  XDR_farr<3UL>::set(&wdr_cloud_type,&this->cloud_type);
  XDR_farr<3UL>::set(&wdr_cloud_coverage_percent,&this->cloud_coverage_percent);
  XDR_farr<3UL>::set(&wdr_cloud_base_msl_m,&this->cloud_base_msl_m);
  XDR_farr<3UL>::set(&wdr_cloud_tops_msl_m,&this->cloud_tops_msl_m);
  XDR_float::set(&wdr_tropo_temp_c,this->tropo_temp_c);
  XDR_float::set(&wdr_tropo_alt_m,this->tropo_alt_m);
  XDR_float::set(&wdr_thermal_rate_ms,this->thermal_rate_ms);
  XDR_float::set(&wdr_wave_amplitude,this->wave_amplitude);
  XDR_float::set(&wdr_wave_dir,this->wave_dir);
  XDR_float::set(&wdr_runway_friction,(float)this->runway_friction);
  XDR_float::set(&wdr_variability_pct,this->variability_pct);
  if ((dataRefs.bDebugWeather != 0) && (dataRefs.iLogLevel == logDEBUG)) {
    __s = "Set Weather";
    if (this->update_immediately != false) {
      __s = "Set Weather immediately";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
    Log(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void LTWeather::Set () const
{
    wdr_update_immediately.set(update_immediately);

    wdr_change_mode.set(WDR_CM_STATIC);             // 3 - Static (this also switches off XP's real weather)

    wdr_visibility_reported_sm.set(visibility_reported_sm);
    wdr_sealevel_temperature_c.set(sealevel_temperature_c);
    wdr_qnh_base_elevation.set(qnh_base_elevation);
    if (!std::isnan(qnh_pas))                       // prefer QNH as it is typically as reported by METAR
        wdr_qnh_pas.set(qnh_pas);
    else
        wdr_sealevel_pressure_pas.set(sealevel_pressure_pas);
    wdr_rain_percent.set(rain_percent);
    wdr_wind_altitude_msl_m.set(wind_altitude_msl_m);
    wdr_wind_speed_msc.set(wind_speed_msc);
    wdr_wind_direction_degt.set(wind_direction_degt);
    wdr_shear_speed_msc.set(shear_speed_msc);
    wdr_shear_direction_degt.set(shear_direction_degt);
    wdr_turbulence.set(turbulence);
    wdr_dewpoint_deg_c.set(dewpoint_deg_c);
    wdr_temperature_altitude_msl_m.set(temperature_altitude_msl_m);
    wdr_temperatures_aloft_deg_c.set(temperatures_aloft_deg_c);
    wdr_cloud_type.set(cloud_type);
    wdr_cloud_coverage_percent.set(cloud_coverage_percent);
    wdr_cloud_base_msl_m.set(cloud_base_msl_m);
    wdr_cloud_tops_msl_m.set(cloud_tops_msl_m);
    wdr_tropo_temp_c.set(tropo_temp_c);
    wdr_tropo_alt_m.set(tropo_alt_m);
    wdr_thermal_rate_ms.set(thermal_rate_ms);
    wdr_wave_amplitude.set(wave_amplitude);
    wdr_wave_dir.set(wave_dir);
    wdr_runway_friction.set(float(runway_friction));
    wdr_variability_pct.set(variability_pct);

    if (dataRefs.ShallLogWeather())
        Log(update_immediately ? "Set Weather immediately" : "Set Weather");
}